

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_string_tpl.h
# Opt level: O0

void insert_string_roll(deflate_state *s,uint32_t str,uint32_t count)

{
  uint uVar1;
  uchar *puVar2;
  Pos head;
  uint32_t hm;
  uint32_t val;
  Pos idx;
  uint8_t *strend;
  uint8_t *strstart;
  uint32_t count_local;
  uint32_t str_local;
  deflate_state *s_local;
  
  strstart = s->window + (ulong)str + 2;
  puVar2 = strstart + count;
  idx = (Pos)str;
  for (; strstart < puVar2; strstart = strstart + 1) {
    s->ins_h = s->ins_h << 5 ^ (uint)*strstart;
    s->ins_h = s->ins_h & 0x7fff;
    uVar1 = s->ins_h;
    if (s->head[uVar1] != idx) {
      s->prev[(uint)idx & s->w_mask] = s->head[uVar1];
      s->head[uVar1] = idx;
    }
    idx = idx + 1;
  }
  return;
}

Assistant:

Z_INTERNAL void INSERT_STRING(deflate_state *const s, uint32_t str, uint32_t count) {
    uint8_t *strstart = s->window + str + HASH_CALC_OFFSET;
    uint8_t *strend = strstart + count;

    for (Pos idx = (Pos)str; strstart < strend; idx++, strstart++) {
        uint32_t val, hm;

        HASH_CALC_VAR_INIT;
        HASH_CALC_READ;
        HASH_CALC(HASH_CALC_VAR, val);
        HASH_CALC_VAR &= HASH_CALC_MASK;
        hm = HASH_CALC_VAR;

        Pos head = s->head[hm];
        if (LIKELY(head != idx)) {
            s->prev[idx & s->w_mask] = head;
            s->head[hm] = idx;
        }
    }
}